

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::PageHeader::PageHeader(PageHeader *this,PageHeader *other87)

{
  long in_RSI;
  TBase *in_RDI;
  DataPageHeaderV2 *other71;
  DataPageHeader *in_stack_ffffffffffffffc0;
  DataPageHeaderV2 *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__PageHeader_00c01dd8;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__PageHeader_00c01dd8;
  other71 = (DataPageHeaderV2 *)(in_RDI + 3);
  DataPageHeader::DataPageHeader(in_stack_ffffffffffffffc0);
  this_00 = (DataPageHeaderV2 *)(in_RDI + 0x1b);
  IndexPageHeader::IndexPageHeader((IndexPageHeader *)this_00);
  DictionaryPageHeader::DictionaryPageHeader((DictionaryPageHeader *)this_00);
  DataPageHeaderV2::DataPageHeaderV2(this_00);
  _PageHeader__isset::_PageHeader__isset((_PageHeader__isset *)(in_RDI + 0x39));
  *(undefined4 *)&in_RDI[1]._vptr_TBase = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)((long)&in_RDI[1]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)&in_RDI[2]._vptr_TBase = *(undefined4 *)(in_RSI + 0x10);
  *(undefined4 *)((long)&in_RDI[2]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0x14);
  DataPageHeader::operator=((DataPageHeader *)this_00,(DataPageHeader *)other71);
  IndexPageHeader::operator=((IndexPageHeader *)(in_RDI + 0x1b),(IndexPageHeader *)(in_RSI + 0xd8));
  DictionaryPageHeader::operator=
            ((DictionaryPageHeader *)(in_RDI + 0x1c),(DictionaryPageHeader *)(in_RSI + 0xe0));
  DataPageHeaderV2::operator=(this_00,other71);
  *(undefined1 *)&in_RDI[0x39]._vptr_TBase = *(undefined1 *)(in_RSI + 0x1c8);
  return;
}

Assistant:

PageHeader::PageHeader(const PageHeader& other87) {
  type = other87.type;
  uncompressed_page_size = other87.uncompressed_page_size;
  compressed_page_size = other87.compressed_page_size;
  crc = other87.crc;
  data_page_header = other87.data_page_header;
  index_page_header = other87.index_page_header;
  dictionary_page_header = other87.dictionary_page_header;
  data_page_header_v2 = other87.data_page_header_v2;
  __isset = other87.__isset;
}